

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

bool google::protobuf::compiler::php::IsReservedName(string_view name)

{
  ulong uVar1;
  bool bVar2;
  char *in_RCX;
  ulong uVar3;
  int *piVar4;
  string_view s;
  string lower;
  string local_40;
  
  s._M_str = in_RCX;
  s._M_len = (size_t)name._M_str;
  absl::lts_20250127::AsciiStrToLower_abi_cxx11_(&local_40,(lts_20250127 *)name._M_len,s);
  piVar4 = &_ZL14kReservedNames_rel;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 0x50) break;
    bVar2 = std::operator==(&local_40,(char *)((long)&_ZL14kReservedNames_rel + (long)*piVar4));
    piVar4 = piVar4 + 1;
    uVar1 = uVar3 + 1;
  } while (!bVar2);
  std::__cxx11::string::~string((string *)&local_40);
  return uVar3 < 0x50;
}

Assistant:

bool IsReservedName(absl::string_view name) {
  std::string lower = absl::AsciiStrToLower(name);
  for (int i = 0; i < kReservedNamesSize; i++) {
    if (lower == kReservedNames[i]) {
      return true;
    }
  }
  return false;
}